

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O1

void __thiscall t_dart_generator::init_generator(t_dart_generator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  int *piVar4;
  long *plVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  char *pcVar7;
  size_type *psVar8;
  string subdir;
  allocator local_91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  char *local_50 [2];
  char local_40 [16];
  
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_70,this);
  iVar3 = mkdir(local_70._M_dataplus._M_p,0x1ff);
  paVar1 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (iVar3 == -1) {
    piVar4 = __errno_location();
    if (*piVar4 != 0x11) {
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
      (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(local_50,this);
      std::__cxx11::string::string((string *)&local_90,local_50[0],&local_91);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_70._M_dataplus._M_p = (pointer)*plVar5;
      psVar8 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_70._M_dataplus._M_p == psVar8) {
        local_70.field_2._M_allocated_capacity = *psVar8;
        local_70.field_2._8_8_ = plVar5[3];
        local_70._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_70.field_2._M_allocated_capacity = *psVar8;
      }
      local_70._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      pcVar7 = strerror(*piVar4);
      std::operator+(pbVar6,&local_70,pcVar7);
      __cxa_throw(pbVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  if ((this->library_name_)._M_string_length == 0) {
    find_library_name_abi_cxx11_
              (&local_70,this,(this->super_t_oop_generator).super_t_generator.program_);
    std::__cxx11::string::operator=((string *)&this->library_name_,(string *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p);
    }
  }
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(local_50,this);
  plVar5 = (long *)std::__cxx11::string::append((char *)local_50);
  paVar2 = &local_90.field_2;
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_90.field_2._M_allocated_capacity = *psVar8;
    local_90.field_2._8_8_ = plVar5[3];
    local_90._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar8;
    local_90._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_90._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)(this->library_name_)._M_dataplus._M_p);
  psVar8 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar8) {
    local_70.field_2._M_allocated_capacity = *psVar8;
    local_70.field_2._8_8_ = plVar5[3];
    local_70._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar8;
    local_70._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_70._M_string_length = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  iVar3 = mkdir(local_70._M_dataplus._M_p,0x1ff);
  if (iVar3 == -1) {
    piVar4 = __errno_location();
    if (*piVar4 != 0x11) {
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
      std::__cxx11::string::string((string *)local_50,local_70._M_dataplus._M_p,&local_91);
      plVar5 = (long *)std::__cxx11::string::append((char *)local_50);
      local_90._M_dataplus._M_p = (pointer)*plVar5;
      psVar8 = (size_type *)(plVar5 + 2);
      if ((size_type *)local_90._M_dataplus._M_p == psVar8) {
        local_90.field_2._M_allocated_capacity = *psVar8;
        local_90.field_2._8_8_ = plVar5[3];
        local_90._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar8;
      }
      local_90._M_string_length = plVar5[1];
      *plVar5 = (long)psVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      pcVar7 = strerror(*piVar4);
      std::operator+(pbVar6,&local_90,pcVar7);
      __cxa_throw(pbVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  std::__cxx11::string::_M_assign((string *)&this->base_dir_);
  if ((this->library_prefix_)._M_string_length == 0) {
    std::__cxx11::string::append((char *)&local_70);
    iVar3 = mkdir(local_70._M_dataplus._M_p,0x1ff);
    if (iVar3 == -1) {
      piVar4 = __errno_location();
      if (*piVar4 != 0x11) {
        pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x20);
        std::__cxx11::string::string((string *)local_50,local_70._M_dataplus._M_p,&local_91);
        plVar5 = (long *)std::__cxx11::string::append((char *)local_50);
        local_90._M_dataplus._M_p = (pointer)*plVar5;
        psVar8 = (size_type *)(plVar5 + 2);
        if ((size_type *)local_90._M_dataplus._M_p == psVar8) {
          local_90.field_2._M_allocated_capacity = *psVar8;
          local_90.field_2._8_8_ = plVar5[3];
          local_90._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_90.field_2._M_allocated_capacity = *psVar8;
        }
        local_90._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        pcVar7 = strerror(*piVar4);
        std::operator+(pbVar6,&local_90,pcVar7);
        __cxa_throw(pbVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
    }
    std::__cxx11::string::append((char *)&local_70);
    iVar3 = mkdir(local_70._M_dataplus._M_p,0x1ff);
    if (iVar3 == -1) {
      piVar4 = __errno_location();
      if (*piVar4 != 0x11) {
        pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x20);
        std::__cxx11::string::string((string *)local_50,local_70._M_dataplus._M_p,&local_91);
        plVar5 = (long *)std::__cxx11::string::append((char *)local_50);
        local_90._M_dataplus._M_p = (pointer)*plVar5;
        psVar8 = (size_type *)(plVar5 + 2);
        if ((size_type *)local_90._M_dataplus._M_p == psVar8) {
          local_90.field_2._M_allocated_capacity = *psVar8;
          local_90.field_2._8_8_ = plVar5[3];
          local_90._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_90.field_2._M_allocated_capacity = *psVar8;
        }
        local_90._M_string_length = plVar5[1];
        *plVar5 = (long)psVar8;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        pcVar7 = strerror(*piVar4);
        std::operator+(pbVar6,&local_90,pcVar7);
        __cxa_throw(pbVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
    }
  }
  std::__cxx11::string::_M_assign((string *)&this->src_dir_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_dart_generator::init_generator() {
  MKDIR(get_out_dir().c_str());

  if (library_name_.empty()) {
    library_name_ = find_library_name(program_);
  }

  string subdir = get_out_dir() + "/" + library_name_;
  MKDIR(subdir.c_str());
  base_dir_ = subdir;

  if (library_prefix_.empty()) {
    subdir += "/lib";
    MKDIR(subdir.c_str());
    subdir += "/src";
    MKDIR(subdir.c_str());
    src_dir_ = subdir;
  } else {
    src_dir_ = base_dir_;
  }
}